

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SupportVectorRegressor::SerializeWithCachedSizes
          (SupportVectorRegressor *this,CodedOutputStream *output)

{
  bool bVar1;
  double dVar2;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  SupportVectorRegressor *this_local;
  
  bVar1 = has_kernel(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&this->kernel_->super_MessageLite,output);
  }
  bVar1 = has_sparsesupportvectors(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&((this->supportVectors_).sparsesupportvectors_)->super_MessageLite,output);
  }
  bVar1 = has_densesupportvectors(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (3,&((this->supportVectors_).sparsesupportvectors_)->super_MessageLite,output);
  }
  bVar1 = has_coefficients(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (4,&this->coefficients_->super_MessageLite,output);
  }
  dVar2 = rho(this);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    dVar2 = rho(this);
    google::protobuf::internal::WireFormatLite::WriteDouble(5,dVar2,output);
  }
  return;
}

Assistant:

void SupportVectorRegressor::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SupportVectorRegressor)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.Kernel kernel = 1;
  if (this->has_kernel()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *this->kernel_, output);
  }

  // .CoreML.Specification.SparseSupportVectors sparseSupportVectors = 2;
  if (has_sparsesupportvectors()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *supportVectors_.sparsesupportvectors_, output);
  }

  // .CoreML.Specification.DenseSupportVectors denseSupportVectors = 3;
  if (has_densesupportvectors()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3, *supportVectors_.densesupportvectors_, output);
  }

  // .CoreML.Specification.Coefficients coefficients = 4;
  if (this->has_coefficients()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      4, *this->coefficients_, output);
  }

  // double rho = 5;
  if (this->rho() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(5, this->rho(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SupportVectorRegressor)
}